

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O1

pair<unsigned_long,_bool>
detail::
do_try_get_deserialized_size<std::tuple<std::pair<person,person>,std::vector<person,std::allocator<person>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>>
          (void)

{
  pair<unsigned_long,_bool> pVar1;
  
  pVar1 = do_try_get_deserialized_size<std::tuple<std::pair<person,person>,std::vector<person,std::allocator<person>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>>(span<std::byte_const>,value_tag<(serialization_category)6>)
          ::{lambda((auto:1)...)#1}::operator()();
  return pVar1;
}

Assistant:

std::pair<size_t, bool> do_try_get_deserialized_size(span<std::byte const> buffer, value_tag<serialization_category::tuple>) noexcept {
        return std::apply([&] (auto...tags) {
            auto const data_begin = buffer.begin();
            auto const try_one    = [&] (auto tag) {
                using value_type = remove_deep_constness_t<typename decltype(tag)::type>;
                auto const [size, success] = try_get_deserialized_size<value_type>(buffer);
                if (!success) return false;
                buffer.begin() += size;
                return true;
            };
            auto const success = (try_one(tags) && ...);
            return std::pair<size_t, bool>{ buffer.begin() - data_begin, success };
        }, map_tuple_types_t<T, tag_type>{});
    }